

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Application.cpp
# Opt level: O0

OrderCancelReplaceRequest * __thiscall
Application::queryCancelReplaceRequest40
          (OrderCancelReplaceRequest *__return_storage_ptr__,Application *this)

{
  bool bVar1;
  Header *header;
  OrderQty local_3a0;
  allocator<char> local_341;
  string local_340;
  Price local_320;
  allocator<char> local_2c1;
  string local_2c0;
  OrdType local_2a0;
  OrderQty local_248;
  Side local_1f0;
  Symbol local_198;
  CHAR local_139;
  HandlInst local_138;
  ClOrdID local_d0;
  OrigClOrdID local_78;
  undefined1 local_19;
  Application *local_18;
  Application *this_local;
  OrderCancelReplaceRequest *cancelReplaceRequest;
  
  local_19 = 0;
  local_18 = this;
  this_local = (Application *)__return_storage_ptr__;
  queryOrigClOrdID(&local_78,this);
  queryClOrdID(&local_d0,this);
  local_139 = '1';
  FIX::HandlInst::HandlInst(&local_138,&local_139);
  querySymbol(&local_198,this);
  querySide(&local_1f0,this);
  queryOrderQty(&local_248,this);
  queryOrdType(&local_2a0,this);
  FIX40::OrderCancelReplaceRequest::OrderCancelReplaceRequest
            (__return_storage_ptr__,&local_78,&local_d0,&local_138,&local_198,&local_1f0,&local_248,
             &local_2a0);
  FIX::OrdType::~OrdType(&local_2a0);
  FIX::OrderQty::~OrderQty(&local_248);
  FIX::Side::~Side(&local_1f0);
  FIX::Symbol::~Symbol(&local_198);
  FIX::HandlInst::~HandlInst(&local_138);
  FIX::ClOrdID::~ClOrdID(&local_d0);
  FIX::OrigClOrdID::~OrigClOrdID(&local_78);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2c0,"New price",&local_2c1);
  bVar1 = queryConfirm(this,&local_2c0);
  std::__cxx11::string::~string((string *)&local_2c0);
  std::allocator<char>::~allocator(&local_2c1);
  if (bVar1) {
    queryPrice(&local_320,this);
    FIX40::OrderCancelReplaceRequest::set(__return_storage_ptr__,&local_320);
    FIX::Price::~Price(&local_320);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_340,"New quantity",&local_341)
  ;
  bVar1 = queryConfirm(this,&local_340);
  std::__cxx11::string::~string((string *)&local_340);
  std::allocator<char>::~allocator(&local_341);
  if (bVar1) {
    queryOrderQty(&local_3a0,this);
    FIX40::OrderCancelReplaceRequest::set(__return_storage_ptr__,&local_3a0);
    FIX::OrderQty::~OrderQty(&local_3a0);
  }
  header = FIX40::Message::getHeader(&__return_storage_ptr__->super_Message);
  queryHeader(this,(Header *)header);
  return __return_storage_ptr__;
}

Assistant:

FIX40::OrderCancelReplaceRequest Application::queryCancelReplaceRequest40() {
  FIX40::OrderCancelReplaceRequest cancelReplaceRequest(
      queryOrigClOrdID(),
      queryClOrdID(),
      FIX::HandlInst('1'),
      querySymbol(),
      querySide(),
      queryOrderQty(),
      queryOrdType());

  if (queryConfirm("New price")) {
    cancelReplaceRequest.set(queryPrice());
  }
  if (queryConfirm("New quantity")) {
    cancelReplaceRequest.set(queryOrderQty());
  }

  queryHeader(cancelReplaceRequest.getHeader());
  return cancelReplaceRequest;
}